

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

void link_frame_received(void *context,AMQP_VALUE performative,uint32_t payload_size,
                        uchar *payload_bytes)

{
  _Bool _Var1;
  int iVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG local_180;
  LOGGER_LOG l_18;
  LOGGER_LOG l_17;
  LOGGER_LOG l_16;
  ERROR_HANDLE error;
  LOGGER_LOG p_Stack_150;
  _Bool closed;
  LOGGER_LOG l_15;
  DETACH_HANDLE detach;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  AMQP_VALUE delivery_state_1;
  DELIVERY_INSTANCE *delivery_instance;
  LOGGER_LOG l_12;
  ASYNC_OPERATION_HANDLE pending_delivery_operation;
  LIST_ITEM_HANDLE next_pending_delivery;
  LIST_ITEM_HANDLE pending_delivery;
  LOGGER_LOG p_Stack_f8;
  _Bool settled;
  LOGGER_LOG l_11;
  delivery_number last;
  delivery_number first;
  LOGGER_LOG l_10;
  DISPOSITION_HANDLE disposition;
  LOGGER_LOG l_9;
  LINK_INSTANCE *pLStack_c8;
  uint32_t indicate_payload_size;
  uchar *indicate_payload_bytes;
  LOGGER_LOG l_8;
  size_t realloc_size;
  uchar *new_received_payload;
  LOGGER_LOG l_7;
  _Bool is_error;
  AMQP_VALUE pAStack_98;
  _Bool more;
  AMQP_VALUE delivery_state;
  LOGGER_LOG l_6;
  TRANSFER_HANDLE transfer_handle;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  uint32_t rcv_link_credit;
  delivery_number rcv_delivery_count;
  LOGGER_LOG l_3;
  FLOW_HANDLE flow_handle;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  ATTACH_HANDLE attach_handle;
  AMQP_VALUE descriptor;
  LINK_INSTANCE *link_instance;
  uchar *payload_bytes_local;
  AMQP_VALUE pAStack_18;
  uint32_t payload_size_local;
  AMQP_VALUE performative_local;
  void *context_local;
  
  descriptor = (AMQP_VALUE)context;
  link_instance = (LINK_INSTANCE *)payload_bytes;
  payload_bytes_local._4_4_ = payload_size;
  pAStack_18 = performative;
  performative_local = (AMQP_VALUE)context;
  attach_handle = (ATTACH_HANDLE)amqpvalue_get_inplace_descriptor(performative);
  _Var1 = is_attach_type_by_descriptor((AMQP_VALUE)attach_handle);
  if (_Var1) {
    iVar2 = amqpvalue_get_attach(pAStack_18,(ATTACH_HANDLE *)&l);
    if (iVar2 == 0) {
      if (((descriptor[2].value.uuid_value[0xc] & 1) == 1) &&
         (iVar2 = attach_get_initial_delivery_count
                            ((ATTACH_HANDLE)l,(sequence_no *)(descriptor[2].value.uuid_value + 8)),
         iVar2 != 0)) {
        l_2 = xlogging_get_log_function();
        if (l_2 != (LOGGER_LOG)0x0) {
          (*l_2)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                 ,"link_frame_received",0x14f,1,"Cannot get initial delivery count");
        }
        remove_all_pending_deliveries((LINK_INSTANCE *)descriptor,true);
        set_link_state((LINK_INSTANCE *)descriptor,LINK_STATE_DETACHED);
      }
      else {
        iVar2 = attach_get_max_message_size((ATTACH_HANDLE)l,(uint64_t *)(descriptor + 5));
        if ((iVar2 != 0) &&
           (flow_handle = (FLOW_HANDLE)xlogging_get_log_function(), flow_handle != (FLOW_HANDLE)0x0)
           ) {
          (*(code *)flow_handle)
                    (0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                     ,"link_frame_received",0x157,1,
                     "Could not retrieve peer_max_message_size from attach frame");
        }
        if (((descriptor->value).uint_value == 1) || ((descriptor->value).uint_value == 2)) {
          if ((descriptor[2].value.uuid_value[0xc] & 1) == 1) {
            descriptor[5].value.uint_value = *(uint32_t *)((long)&descriptor[5].value + 4);
            send_flow((LINK_INSTANCE *)descriptor);
          }
          else {
            descriptor[5].value.uint_value = 0;
          }
          if ((descriptor->value).uint_value == 1) {
            set_link_state((LINK_INSTANCE *)descriptor,LINK_STATE_HALF_ATTACHED_ATTACH_RECEIVED);
          }
          else {
            set_link_state((LINK_INSTANCE *)descriptor,LINK_STATE_ATTACHED);
          }
        }
      }
      attach_destroy((ATTACH_HANDLE)l);
    }
    else {
      l_1 = xlogging_get_log_function();
      if (l_1 != (LOGGER_LOG)0x0) {
        (*l_1)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
               ,"link_frame_received",0x148,1,"Cannot get attach performative");
      }
    }
  }
  else {
    _Var1 = is_flow_type_by_descriptor((AMQP_VALUE)attach_handle);
    if (_Var1) {
      iVar2 = amqpvalue_get_flow(pAStack_18,(FLOW_HANDLE *)&l_3);
      if (iVar2 == 0) {
        if ((descriptor[2].value.uuid_value[0xc] & 1) == 0) {
          iVar2 = flow_get_link_credit((FLOW_HANDLE)l_3,(uint32_t *)&l_4);
          if (iVar2 == 0) {
            iVar2 = flow_get_delivery_count((FLOW_HANDLE)l_3,(sequence_no *)((long)&l_4 + 4));
            if (iVar2 == 0) {
              descriptor[5].value.uint_value =
                   (l_4._4_4_ + (int)l_4) - descriptor[2].value.binary_value.length;
              if (descriptor[5].value.uint_value != 0) {
                (*(code *)descriptor[3].value.ulong_value)(*(undefined8 *)(descriptor + 4));
              }
            }
            else {
              transfer_handle = (TRANSFER_HANDLE)xlogging_get_log_function();
              if (transfer_handle != (TRANSFER_HANDLE)0x0) {
                (*(code *)transfer_handle)
                          (0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                           ,"link_frame_received",0x18b,1,"Cannot get delivery count");
              }
              remove_all_pending_deliveries((LINK_INSTANCE *)descriptor,true);
              set_link_state((LINK_INSTANCE *)descriptor,LINK_STATE_DETACHED);
            }
          }
          else {
            l_5 = xlogging_get_log_function();
            if (l_5 != (LOGGER_LOG)0x0) {
              (*l_5)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                     ,"link_frame_received",0x185,1,"Cannot get link credit");
            }
            remove_all_pending_deliveries((LINK_INSTANCE *)descriptor,true);
            set_link_state((LINK_INSTANCE *)descriptor,LINK_STATE_DETACHED);
          }
        }
        flow_destroy((FLOW_HANDLE)l_3);
      }
      else {
        _rcv_link_credit = xlogging_get_log_function();
        if (_rcv_link_credit != (LOGGER_LOG)0x0) {
          (*_rcv_link_credit)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                              ,"link_frame_received",0x17a,1,"Cannot get flow performative");
        }
      }
    }
    else {
      _Var1 = is_transfer_type_by_descriptor((AMQP_VALUE)attach_handle);
      if (_Var1) {
        if (descriptor[3].value.described_value.value != (AMQP_VALUE)0x0) {
          iVar2 = amqpvalue_get_transfer(pAStack_18,(TRANSFER_HANDLE *)&l_6);
          if (iVar2 == 0) {
            if (descriptor[5].value.uint_value < 2) {
              descriptor[5].value.uint_value = *(uint32_t *)((long)&descriptor[5].value + 4);
              send_flow((LINK_INSTANCE *)descriptor);
            }
            l_7._7_1_ = 0;
            transfer_get_more((TRANSFER_HANDLE)l_6,(_Bool *)((long)&l_7 + 7));
            l_7._6_1_ = 0;
            iVar2 = transfer_get_delivery_id
                              ((TRANSFER_HANDLE)l_6,(delivery_number *)&descriptor[7].field_0x4);
            if ((iVar2 != 0) && (descriptor[7].type == AMQP_TYPE_INVALID)) {
              new_received_payload = (uchar *)xlogging_get_log_function();
              if ((LOGGER_LOG)new_received_payload != (LOGGER_LOG)0x0) {
                (*(code *)new_received_payload)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                           ,"link_frame_received",0x1bb,1,
                           "Could not get the delivery Id from the transfer performative");
              }
              l_7._6_1_ = 1;
            }
            if ((l_7._6_1_ & 1) == 0) {
              if ((descriptor[7].type != AMQP_TYPE_INVALID) || ((l_7._7_1_ & 1) != 0)) {
                if ((ulong)descriptor[7].type < -(ulong)payload_bytes_local._4_4_ - 1) {
                  local_180 = (LOGGER_LOG)
                              ((ulong)descriptor[7].type + (ulong)payload_bytes_local._4_4_);
                }
                else {
                  local_180 = (LOGGER_LOG)0xffffffffffffffff;
                }
                l_8 = local_180;
                if ((local_180 == (LOGGER_LOG)0xffffffffffffffff) ||
                   (realloc_size = (size_t)realloc(descriptor[6].value.described_value.value,
                                                   (size_t)local_180),
                   (void *)realloc_size == (void *)0x0)) {
                  indicate_payload_bytes = (uchar *)xlogging_get_log_function();
                  if ((LOGGER_LOG)indicate_payload_bytes != (LOGGER_LOG)0x0) {
                    (*(code *)indicate_payload_bytes)
                              (AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                               ,"link_frame_received",0x1ca,1,
                               "Could not allocate memory for the received payload, size:%zu",l_8);
                  }
                }
                else {
                  *(size_t *)((long)&descriptor[6].value + 8) = realloc_size;
                  memcpy((void *)((long)&(descriptor[6].value.described_value.value)->type +
                                 (ulong)descriptor[7].type),link_instance,
                         (ulong)payload_bytes_local._4_4_);
                  descriptor[7].type = payload_bytes_local._4_4_ + descriptor[7].type;
                }
              }
              if ((l_7._7_1_ & 1) == 0) {
                descriptor[5].value.uint_value = descriptor[5].value.uint_value - 1;
                descriptor[2].value.binary_value.length =
                     descriptor[2].value.binary_value.length + 1;
                if (descriptor[7].type == AMQP_TYPE_INVALID) {
                  l_9._4_4_ = payload_bytes_local._4_4_;
                  pLStack_c8 = link_instance;
                }
                else {
                  l_9._4_4_ = descriptor[7].type;
                  pLStack_c8 = (LINK_INSTANCE *)descriptor[6].value.described_value.value;
                }
                pAStack_98 = (AMQP_VALUE)
                             (**(code **)((long)&descriptor[3].value + 8))
                                       (*(undefined8 *)(descriptor + 4),l_6,l_9._4_4_,pLStack_c8);
                if (descriptor[7].type != AMQP_TYPE_INVALID) {
                  free(descriptor[6].value.described_value.value);
                  descriptor[6].value.described_value.value = (AMQP_VALUE)0x0;
                  descriptor[7].type = AMQP_TYPE_INVALID;
                }
                if (pAStack_98 != (AMQP_VALUE)0x0) {
                  iVar2 = send_disposition((LINK_INSTANCE *)descriptor,
                                           *(delivery_number *)&descriptor[7].field_0x4,pAStack_98);
                  if ((iVar2 != 0) &&
                     (disposition = (DISPOSITION_HANDLE)xlogging_get_log_function(),
                     disposition != (DISPOSITION_HANDLE)0x0)) {
                    (*(code *)disposition)
                              (0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                               ,"link_frame_received",500,1,"Cannot send disposition frame");
                  }
                  amqpvalue_destroy(pAStack_98);
                }
              }
            }
            transfer_destroy((TRANSFER_HANDLE)l_6);
          }
          else {
            delivery_state = (AMQP_VALUE)xlogging_get_log_function();
            if (delivery_state != (AMQP_VALUE)0x0) {
              (*(code *)delivery_state)
                        (0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                         ,"link_frame_received",0x1a3,1,"Cannot get transfer performative");
            }
          }
        }
      }
      else {
        _Var1 = is_disposition_type_by_descriptor((AMQP_VALUE)attach_handle);
        if (_Var1) {
          iVar2 = amqpvalue_get_disposition(pAStack_18,(DISPOSITION_HANDLE *)&l_10);
          if (iVar2 == 0) {
            iVar2 = disposition_get_first
                              ((DISPOSITION_HANDLE)l_10,(delivery_number *)((long)&l_11 + 4));
            if (iVar2 == 0) {
              iVar2 = disposition_get_last((DISPOSITION_HANDLE)l_10,(delivery_number *)&l_11);
              if (iVar2 != 0) {
                l_11._0_4_ = l_11._4_4_;
              }
              iVar2 = disposition_get_settled
                                ((DISPOSITION_HANDLE)l_10,(_Bool *)((long)&pending_delivery + 7));
              if (iVar2 != 0) {
                pending_delivery._7_1_ = 0;
              }
              if (((pending_delivery._7_1_ & 1) != 0) &&
                 (descriptor[2].value.described_value.descriptor != (AMQP_VALUE)0x0)) {
                next_pending_delivery =
                     singlylinkedlist_get_head_item
                               ((SINGLYLINKEDLIST_HANDLE)
                                descriptor[2].value.described_value.descriptor);
                while (next_pending_delivery != (LIST_ITEM_HANDLE)0x0) {
                  pending_delivery_operation =
                       (ASYNC_OPERATION_HANDLE)singlylinkedlist_get_next_item(next_pending_delivery)
                  ;
                  l_12 = (LOGGER_LOG)singlylinkedlist_item_get_value(next_pending_delivery);
                  if (l_12 == (LOGGER_LOG)0x0) {
                    delivery_instance = (DELIVERY_INSTANCE *)xlogging_get_log_function();
                    if (delivery_instance != (DELIVERY_INSTANCE *)0x0) {
                      (*(code *)delivery_instance)
                                (0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                                 ,"link_frame_received",0x228,1,"Cannot obtain pending delivery");
                    }
                    break;
                  }
                  delivery_state_1 = (AMQP_VALUE)(l_12 + 8);
                  if ((l_11._4_4_ <= delivery_state_1->type) &&
                     (delivery_state_1->type <= (AMQP_TYPE)l_11)) {
                    iVar2 = disposition_get_state((DISPOSITION_HANDLE)l_10,(AMQP_VALUE *)&l_13);
                    if (iVar2 == 0) {
                      (*(code *)(delivery_state_1->value).ulong_value)
                                ((delivery_state_1->value).described_value.value,
                                 delivery_state_1->type,1,l_13);
                      async_operation_destroy((ASYNC_OPERATION_HANDLE)l_12);
                    }
                    else {
                      l_14 = xlogging_get_log_function();
                      if (l_14 != (LOGGER_LOG)0x0) {
                        (*l_14)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                                ,"link_frame_received",0x239,1,
                                "Failed getting the disposition state");
                      }
                    }
                    iVar2 = singlylinkedlist_remove
                                      ((SINGLYLINKEDLIST_HANDLE)
                                       descriptor[2].value.described_value.descriptor,
                                       next_pending_delivery);
                    if (iVar2 != 0) {
                      detach = (DETACH_HANDLE)xlogging_get_log_function();
                      if (detach != (DETACH_HANDLE)0x0) {
                        (*(code *)detach)(0,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                                          ,"link_frame_received",0x23e,1,
                                          "Cannot remove pending delivery");
                      }
                      break;
                    }
                  }
                  next_pending_delivery = (LIST_ITEM_HANDLE)pending_delivery_operation;
                }
              }
            }
            else {
              p_Stack_f8 = xlogging_get_log_function();
              if (p_Stack_f8 != (LOGGER_LOG)0x0) {
                (*p_Stack_f8)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                              ,"link_frame_received",0x20e,1,"Cannot get first field");
              }
            }
            disposition_destroy((DISPOSITION_HANDLE)l_10);
          }
          else {
            _last = xlogging_get_log_function();
            if (_last != (LOGGER_LOG)0x0) {
              (*_last)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                       ,"link_frame_received",0x205,1,"Cannot get disposition performative");
            }
          }
        }
        else {
          _Var1 = is_detach_type_by_descriptor((AMQP_VALUE)attach_handle);
          if (_Var1) {
            iVar2 = amqpvalue_get_detach(pAStack_18,(DETACH_HANDLE *)&l_15);
            if (iVar2 == 0) {
              error._7_1_ = 0;
              detach_get_closed((DETACH_HANDLE)l_15,(_Bool *)((long)&error + 7));
              if ((descriptor->value).uint_value == 4) {
                iVar2 = send_detach((LINK_INSTANCE *)descriptor,(_Bool)(error._7_1_ & 1),
                                    (ERROR_HANDLE)0x0);
                if ((iVar2 != 0) &&
                   (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                            ,"link_frame_received",0x262,1,"Failed sending detach frame");
                }
              }
              else if (((error._7_1_ & 1) != 0) &&
                      ((((descriptor->value).uint_value == 2 ||
                        ((descriptor->value).uint_value == 3)) &&
                       ((descriptor[6].value.uuid_value[1] & 1) == 0)))) {
                iVar2 = send_attach((LINK_INSTANCE *)descriptor,*(char **)(descriptor + 2),0,
                                    (role)(descriptor[2].value.uuid_value[0xc] & 1));
                if ((iVar2 != 0) &&
                   (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                            ,"link_frame_received",0x26e,1,"Failed sending attach frame");
                }
                iVar2 = send_detach((LINK_INSTANCE *)descriptor,true,(ERROR_HANDLE)0x0);
                if ((iVar2 != 0) &&
                   (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                            ,"link_frame_received",0x273,1,"Failed sending detach frame");
                }
              }
              iVar2 = detach_get_error((DETACH_HANDLE)l_15,(ERROR_HANDLE *)&l_16);
              if (iVar2 != 0) {
                l_16 = (LOGGER_LOG)0x0;
              }
              remove_all_pending_deliveries((LINK_INSTANCE *)descriptor,true);
              if (descriptor[7].value.described_value.value != (AMQP_VALUE)0x0) {
                (**(code **)((long)&descriptor[7].value + 8))(*(undefined8 *)(descriptor + 8),l_16);
              }
              if (l_16 == (LOGGER_LOG)0x0) {
                set_link_state((LINK_INSTANCE *)descriptor,LINK_STATE_DETACHED);
              }
              else {
                set_link_state((LINK_INSTANCE *)descriptor,LINK_STATE_ERROR);
                error_destroy((ERROR_HANDLE)l_16);
              }
              detach_destroy((DETACH_HANDLE)l_15);
            }
            else {
              p_Stack_150 = xlogging_get_log_function();
              if (p_Stack_150 != (LOGGER_LOG)0x0) {
                (*p_Stack_150)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                               ,"link_frame_received",0x253,1,"Cannot get detach performative");
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void link_frame_received(void* context, AMQP_VALUE performative, uint32_t payload_size, const unsigned char* payload_bytes)
{
    LINK_INSTANCE* link_instance = (LINK_INSTANCE*)context;
    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(performative);

    if (is_attach_type_by_descriptor(descriptor))
    {
        ATTACH_HANDLE attach_handle;

        if (amqpvalue_get_attach(performative, &attach_handle) != 0)
        {
            LogError("Cannot get attach performative");
        }
        else
        {
            if ((link_instance->role == role_receiver) &&
                (attach_get_initial_delivery_count(attach_handle, &link_instance->delivery_count) != 0))
            {
                LogError("Cannot get initial delivery count");
                remove_all_pending_deliveries(link_instance, true);
                set_link_state(link_instance, LINK_STATE_DETACHED);
            }
            else
            {
                if (attach_get_max_message_size(attach_handle, &link_instance->peer_max_message_size) != 0)
                {
                    LogError("Could not retrieve peer_max_message_size from attach frame");
                }

                if ((link_instance->link_state == LINK_STATE_DETACHED) ||
                    (link_instance->link_state == LINK_STATE_HALF_ATTACHED_ATTACH_SENT))
                {
                    if (link_instance->role == role_receiver)
                    {
                        link_instance->current_link_credit = link_instance->max_link_credit;
                        send_flow(link_instance);
                    }
                    else
                    {
                        link_instance->current_link_credit = 0;
                    }

                    if (link_instance->link_state == LINK_STATE_DETACHED)
                    {
                        set_link_state(link_instance, LINK_STATE_HALF_ATTACHED_ATTACH_RECEIVED);
                    }
                    else
                    {
                        set_link_state(link_instance, LINK_STATE_ATTACHED);
                    }
                }
            }

            attach_destroy(attach_handle);
        }
    }
    else if (is_flow_type_by_descriptor(descriptor))
    {
        FLOW_HANDLE flow_handle;
        if (amqpvalue_get_flow(performative, &flow_handle) != 0)
        {
            LogError("Cannot get flow performative");
        }
        else
        {
            if (link_instance->role == role_sender)
            {
                delivery_number rcv_delivery_count;
                uint32_t rcv_link_credit;

                if (flow_get_link_credit(flow_handle, &rcv_link_credit) != 0)
                {
                    LogError("Cannot get link credit");
                    remove_all_pending_deliveries(link_instance, true);
                    set_link_state(link_instance, LINK_STATE_DETACHED);
                }
                else if (flow_get_delivery_count(flow_handle, &rcv_delivery_count) != 0)
                {
                    LogError("Cannot get delivery count");
                    remove_all_pending_deliveries(link_instance, true);
                    set_link_state(link_instance, LINK_STATE_DETACHED);
                }
                else
                {
                    link_instance->current_link_credit = rcv_delivery_count + rcv_link_credit - link_instance->delivery_count;
                    if (link_instance->current_link_credit > 0)
                    {
                        link_instance->on_link_flow_on(link_instance->callback_context);
                    }
                }
            }

            flow_destroy(flow_handle);
        }
    }
    else if (is_transfer_type_by_descriptor(descriptor))
    {
        if (link_instance->on_transfer_received != NULL)
        {
            TRANSFER_HANDLE transfer_handle;
            if (amqpvalue_get_transfer(performative, &transfer_handle) != 0)
            {
                LogError("Cannot get transfer performative");
            }
            else
            {
                AMQP_VALUE delivery_state;
                bool more;
                bool is_error;

                if (link_instance->current_link_credit <= RECEIVER_MIN_LINK_CREDIT)
                {
                    link_instance->current_link_credit = link_instance->max_link_credit;
                    send_flow(link_instance);
                }

                more = false;
                /* Attempt to get more flag, default to false */
                (void)transfer_get_more(transfer_handle, &more);
                is_error = false;

                if (transfer_get_delivery_id(transfer_handle, &link_instance->received_delivery_id) != 0)
                {
                    /* is this not a continuation transfer? */
                    if (link_instance->received_payload_size == 0)
                    {
                        LogError("Could not get the delivery Id from the transfer performative");
                        is_error = true;
                    }
                }

                if (!is_error)
                {
                    /* If this is a continuation transfer or if this is the first chunk of a multi frame transfer */
                    if ((link_instance->received_payload_size > 0) || more)
                    {
                        unsigned char* new_received_payload;;
                        size_t realloc_size = safe_add_size_t((size_t)link_instance->received_payload_size, payload_size);
                        if (realloc_size == SIZE_MAX ||
                            (new_received_payload = (unsigned char*)realloc(link_instance->received_payload, realloc_size)) == NULL)
                        {
                            LogError("Could not allocate memory for the received payload, size:%zu", realloc_size);
                        }
                        else
                        {
                            link_instance->received_payload = new_received_payload;
                            (void)memcpy(link_instance->received_payload + link_instance->received_payload_size, payload_bytes, payload_size);
                            link_instance->received_payload_size += payload_size;
                        }
                    }

                    if (!more)
                    {
                        const unsigned char* indicate_payload_bytes;
                        uint32_t indicate_payload_size;

                        link_instance->current_link_credit--;
                        link_instance->delivery_count++;
                        /* if no previously stored chunks then simply report the current payload */
                        if (link_instance->received_payload_size > 0)
                        {
                            indicate_payload_size = link_instance->received_payload_size;
                            indicate_payload_bytes = link_instance->received_payload;
                        }
                        else
                        {
                            indicate_payload_size = payload_size;
                            indicate_payload_bytes = payload_bytes;
                        }

                        delivery_state = link_instance->on_transfer_received(link_instance->callback_context, transfer_handle, indicate_payload_size, indicate_payload_bytes);

                        if (link_instance->received_payload_size > 0)
                        {
                            free(link_instance->received_payload);
                            link_instance->received_payload = NULL;
                            link_instance->received_payload_size = 0;
                        }

                        if (delivery_state != NULL)
                        {
                            if (send_disposition(link_instance, link_instance->received_delivery_id, delivery_state) != 0)
                            {
                                LogError("Cannot send disposition frame");
                            }

                            amqpvalue_destroy(delivery_state);
                        }
                    }
                }

                transfer_destroy(transfer_handle);
            }
        }
    }
    else if (is_disposition_type_by_descriptor(descriptor))
    {
        DISPOSITION_HANDLE disposition;
        if (amqpvalue_get_disposition(performative, &disposition) != 0)
        {
            LogError("Cannot get disposition performative");
        }
        else
        {
            delivery_number first;
            delivery_number last;

            if (disposition_get_first(disposition, &first) != 0)
            {
                LogError("Cannot get first field");
            }
            else
            {
                bool settled;

                if (disposition_get_last(disposition, &last) != 0)
                {
                    last = first;
                }

                if (disposition_get_settled(disposition, &settled) != 0)
                {
                    settled = false;
                }

                if (settled && 
                    link_instance->pending_deliveries != NULL)
                {
                    LIST_ITEM_HANDLE pending_delivery = singlylinkedlist_get_head_item(link_instance->pending_deliveries);
                    while (pending_delivery != NULL)
                    {
                        LIST_ITEM_HANDLE next_pending_delivery = singlylinkedlist_get_next_item(pending_delivery);
                        ASYNC_OPERATION_HANDLE pending_delivery_operation = (ASYNC_OPERATION_HANDLE)singlylinkedlist_item_get_value(pending_delivery);
                        if (pending_delivery_operation == NULL)
                        {
                            LogError("Cannot obtain pending delivery");
                            break;
                        }
                        else
                        {
                            DELIVERY_INSTANCE* delivery_instance = (DELIVERY_INSTANCE*)GET_ASYNC_OPERATION_CONTEXT(DELIVERY_INSTANCE, pending_delivery_operation);

                            if ((delivery_instance->delivery_id >= first) && (delivery_instance->delivery_id <= last))
                            {
                                AMQP_VALUE delivery_state;
                                if (disposition_get_state(disposition, &delivery_state) == 0)
                                {
                                    delivery_instance->on_delivery_settled(delivery_instance->callback_context, delivery_instance->delivery_id, LINK_DELIVERY_SETTLE_REASON_DISPOSITION_RECEIVED, delivery_state);
                                    async_operation_destroy(pending_delivery_operation);
                                }
                                else
                                {
                                    LogError("Failed getting the disposition state");
                                }

                                if (singlylinkedlist_remove(link_instance->pending_deliveries, pending_delivery) != 0)
                                {
                                    LogError("Cannot remove pending delivery");
                                    break;
                                }
                            }

                            pending_delivery = next_pending_delivery;
                        }
                    }
                }
            }

            disposition_destroy(disposition);
        }
    }
    else if (is_detach_type_by_descriptor(descriptor))
    {
        DETACH_HANDLE detach;

        /* Set link state appropriately based on whether we received detach condition */
        if (amqpvalue_get_detach(performative, &detach) != 0)
        {
            LogError("Cannot get detach performative");
        }
        else
        {
            bool closed = false;
            ERROR_HANDLE error;

            (void)detach_get_closed(detach, &closed);

            /* Received a detach while attached */
            if (link_instance->link_state == LINK_STATE_ATTACHED)
            {
                /* Respond with ack */
                if (send_detach(link_instance, closed, NULL) != 0)
                {
                    LogError("Failed sending detach frame");
                }
            }
            /* Received a closing detach after we sent a non-closing detach. */
            else if (closed &&
                ((link_instance->link_state == LINK_STATE_HALF_ATTACHED_ATTACH_SENT) || (link_instance->link_state == LINK_STATE_HALF_ATTACHED_ATTACH_RECEIVED)) &&
                !link_instance->is_closed)
            {

                /* In this case, we MUST signal that we closed by reattaching and then sending a closing detach.*/
                if (send_attach(link_instance, link_instance->name, 0, link_instance->role) != 0)
                {
                    LogError("Failed sending attach frame");
                }

                if (send_detach(link_instance, true, NULL) != 0)
                {
                    LogError("Failed sending detach frame");
                }
            }

            if (detach_get_error(detach, &error) != 0)
            {
                error = NULL;
            }
            remove_all_pending_deliveries(link_instance, true);
            // signal link detach received in order to handle cases like redirect
            if (link_instance->on_link_detach_received_event_subscription.on_link_detach_received != NULL)
            {
                link_instance->on_link_detach_received_event_subscription.on_link_detach_received(link_instance->on_link_detach_received_event_subscription.context, error);
            }

            if (error != NULL)
            {
                set_link_state(link_instance, LINK_STATE_ERROR);
                error_destroy(error);
            }
            else
            {
                set_link_state(link_instance, LINK_STATE_DETACHED);
            }

            detach_destroy(detach);
        }
    }
}